

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::thread_entry(command_processor *this,fifo_path *fifo)

{
  not_null<const_char_*> fifo_00;
  bool bVar1;
  type msg_00;
  double __x;
  double __x_00;
  not_null<const_char_*> local_50 [2];
  exception *ex;
  undefined1 local_38 [8];
  message_ptr msg;
  not_null<const_char_*> local_20 [2];
  fifo_path *fifo_local;
  command_processor *this_local;
  
  local_20[1].ptr_ = (char *)fifo;
  fifo_local = (fifo_path *)this;
  pstore::gsl::not_null<const_char_*>::not_null(local_20,"Waiting for commands");
  pstore::log((pstore *)0x6,__x);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->commands_done_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pstore::gsl::not_null<const_char_*>::not_null(local_50,"Exiting command thread");
      pstore::log((pstore *)0x6,__x_00);
      return;
    }
    message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
    ::pop((message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
           *)local_38);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
    fifo_00.ptr_ = local_20[1].ptr_;
    if (!bVar1) break;
    msg_00 = std::
             unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             ::operator*((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                          *)local_38);
    process_command(this,(fifo_path *)fifo_00.ptr_,msg_00);
    message_pool::return_to_pool((message_pool *)pool,(message_ptr *)local_38);
    std::
    unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ::~unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                   *)local_38);
  }
  assert_failed("msg",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                ,0xdb);
}

Assistant:

void command_processor::thread_entry (brokerface::fifo_path const & fifo) {
            try {
                pstore::log (priority::info, "Waiting for commands");
                while (!commands_done_) {
                    brokerface::message_ptr msg = messages_.pop ();
                    PSTORE_ASSERT (msg);
                    this->process_command (fifo, *msg);
                    pool.return_to_pool (std::move (msg));
                }
            } catch (std::exception const & ex) {
                pstore::log (priority::error, "An error occurred: ", ex.what ());
            } catch (...) {
                pstore::log (priority::error, "Unknown error");
            }
            pstore::log (priority::info, "Exiting command thread");
        }